

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O1

void __thiscall
jsonnet::internal::Token::Token
          (Token *this,Kind kind,Fodder *fodder,string *data,string *string_block_indent,
          string *string_block_term_indent,LocationRange *location)

{
  pointer pcVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  
  this->kind = kind;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->fodder,fodder);
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  pcVar1 = (data->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->data,pcVar1,pcVar1 + data->_M_string_length);
  (this->stringBlockIndent)._M_dataplus._M_p = (pointer)&(this->stringBlockIndent).field_2;
  pcVar1 = (string_block_indent->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->stringBlockIndent,pcVar1,
             pcVar1 + string_block_indent->_M_string_length);
  (this->stringBlockTermIndent)._M_dataplus._M_p = (pointer)&(this->stringBlockTermIndent).field_2;
  pcVar1 = (string_block_term_indent->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->stringBlockTermIndent,pcVar1,
             pcVar1 + string_block_term_indent->_M_string_length);
  (this->location).file._M_dataplus._M_p = (pointer)&(this->location).file.field_2;
  pcVar1 = (location->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->location,pcVar1,pcVar1 + (location->file)._M_string_length);
  uVar2 = (location->begin).line;
  uVar3 = (location->begin).column;
  uVar4 = (location->end).column;
  (this->location).end.line = (location->end).line;
  (this->location).end.column = uVar4;
  (this->location).begin.line = uVar2;
  (this->location).begin.column = uVar3;
  return;
}

Assistant:

Token(Kind kind, const Fodder &fodder, const std::string &data,
          const std::string &string_block_indent, const std::string &string_block_term_indent,
          const LocationRange &location)
        : kind(kind),
          fodder(fodder),
          data(data),
          stringBlockIndent(string_block_indent),
          stringBlockTermIndent(string_block_term_indent),
          location(location)
    {
    }